

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

bool anon_unknown.dwarf_1d2162::compare
               (FrameBuffer *asRead,FrameBuffer *asWritten,Box2i *dataWindow,bool nonfatal)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint16_t uVar5;
  uint uVar6;
  Slice *pSVar7;
  uint16_t *puVar8;
  uint16_t *puVar9;
  ostream *poVar10;
  char *pcVar11;
  void *this;
  byte in_CL;
  int *in_RDX;
  long lVar12;
  char *in_RSI;
  char *ptr_1;
  intptr_t base_1;
  half writtenHalf;
  half readHalf;
  char *ptr;
  intptr_t base;
  int x;
  int y;
  ConstIterator p;
  ConstIterator i;
  ConstIterator *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint16_t local_7e;
  uint16_t local_7a;
  half local_60;
  uint16_t local_5e;
  uint16_t local_5c;
  half local_5a;
  uint16_t *local_58;
  long local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  byte local_21;
  int *local_20;
  char *local_18;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = Imf_3_2::FrameBuffer::begin();
  do {
    local_38 = Imf_3_2::FrameBuffer::end();
    bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff18);
    pcVar11 = local_18;
    if (!bVar4) {
      return true;
    }
    Imf_3_2::FrameBuffer::ConstIterator::name((ConstIterator *)0x203d8c);
    local_40 = Imf_3_2::FrameBuffer::find(pcVar11);
    for (local_44 = local_20[1]; local_44 <= local_20[3]; local_44 = local_44 + 1) {
      for (local_48 = *local_20; local_48 <= local_20[2]; local_48 = local_48 + 1) {
        pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x203e06);
        lVar2 = *(long *)(pSVar7 + 8);
        local_50 = lVar2;
        pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x203e29);
        lVar3 = *(long *)(pSVar7 + 0x18);
        lVar12 = (long)local_44;
        pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x203e53);
        local_58 = (uint16_t *)(lVar2 + lVar3 * lVar12 + *(long *)(pSVar7 + 0x10) * (long)local_48);
        pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x203e80);
        iVar1 = *(int *)pSVar7;
        if (iVar1 != 0) {
          if (iVar1 == 1) {
            local_5e = *local_58;
            local_5a._h = local_5e;
          }
          else {
            if (iVar1 != 2) {
              std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
              exit(1);
            }
            puVar8 = (uint16_t *)(anonymous_namespace)::alignToFour<char*>((char *)local_58);
            if (puVar8 != local_58) {
              __assert_fail("alignToFour (ptr) == ptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                            ,0xe0,
                            "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                           );
            }
            Imath_3_2::half::half
                      ((half *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (float)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            local_5a._h = local_5c;
          }
          Imf_3_2::FrameBuffer::end();
          bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      in_stack_ffffffffffffff18);
          if (bVar4) {
            pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x203f99);
            lVar2 = *(long *)(pSVar7 + 8);
            pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x203fb6);
            lVar3 = *(long *)(pSVar7 + 0x18);
            lVar12 = (long)local_44;
            pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x203fe0);
            puVar8 = (uint16_t *)
                     (lVar2 + lVar3 * lVar12 + *(long *)(pSVar7 + 0x10) * (long)local_48);
            pSVar7 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x20400a);
            iVar1 = *(int *)pSVar7;
            if (iVar1 == 0) goto LAB_00204262;
            if (iVar1 == 1) {
              local_60._h = *puVar8;
            }
            else {
              if (iVar1 != 2) {
                std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
                exit(1);
              }
              puVar9 = (uint16_t *)(anonymous_namespace)::alignToFour<char*>((char *)puVar8);
              if (puVar9 != puVar8) {
                __assert_fail("alignToFour (ptr) == ptr",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                              ,0xf5,
                              "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                             );
              }
              Imath_3_2::half::half
                        ((half *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (float)((ulong)in_stack_ffffffffffffff18 >> 0x20));
              local_60._h = local_7a;
            }
          }
          else {
            Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x2040d1);
            Imath_3_2::half::half
                      ((half *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (float)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            local_60._h = local_7e;
          }
          uVar5 = Imath_3_2::half::bits(&local_60);
          in_stack_ffffffffffffff24 = (uint)uVar5;
          uVar5 = Imath_3_2::half::bits(&local_5a);
          if (in_stack_ffffffffffffff24 != uVar5) {
            if ((local_21 & 1) != 0) {
              return false;
            }
            poVar10 = std::operator<<((ostream *)&std::cout,"\n\nerror reading back channel ");
            pcVar11 = Imf_3_2::FrameBuffer::ConstIterator::name((ConstIterator *)0x20415f);
            poVar10 = std::operator<<(poVar10,pcVar11);
            poVar10 = std::operator<<(poVar10," pixel ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_48);
            poVar10 = std::operator<<(poVar10,',');
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_44);
            poVar10 = std::operator<<(poVar10," got ");
            poVar10 = (ostream *)::operator<<(poVar10,local_5a);
            poVar10 = std::operator<<(poVar10," expected ");
            this = (void *)::operator<<(poVar10,local_60);
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            uVar5 = Imath_3_2::half::bits(&local_60);
            uVar6 = (uint)uVar5;
            uVar5 = Imath_3_2::half::bits(&local_5a);
            if (uVar6 == uVar5) {
              exit(1);
            }
            __assert_fail("writtenHalf.bits () == readHalf.bits ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                          ,0x10c,
                          "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                         );
          }
        }
LAB_00204262:
      }
    }
    Imf_3_2::FrameBuffer::ConstIterator::operator++(in_stack_ffffffffffffff18,0);
  } while( true );
}

Assistant:

bool
compare (
    const FrameBuffer& asRead,
    const FrameBuffer& asWritten,
    const Box2i&       dataWindow,
    bool               nonfatal)
{
    for (FrameBuffer::ConstIterator i = asRead.begin (); i != asRead.end ();
         i++)
    {
        FrameBuffer::ConstIterator p = asWritten.find (i.name ());
        for (int y = dataWindow.min.y; y <= dataWindow.max.y; y++)
        {
            for (int x = dataWindow.min.x; x <= dataWindow.max.x; x++)

            {
                //
                // extract value read back from file
                //
                intptr_t base = reinterpret_cast<intptr_t> (i.slice ().base);
                char*    ptr  = reinterpret_cast<char*> (
                    base + i.slice ().yStride * intptr_t (y) +
                    i.slice ().xStride * intptr_t (x));
                half readHalf;
                switch (i.slice ().type)
                {
                    case IMF::FLOAT:
                        assert (alignToFour (ptr) == ptr);
                        readHalf = half (*(float*) ptr);
                        break;
                    case IMF::HALF: readHalf = half (*(half*) ptr); break;
                    case IMF::UINT: continue; // can't very well check this
                    default: cout << "don't know about that\n"; exit (1);
                }

                half writtenHalf;

                if (p != asWritten.end ())
                {

                    intptr_t base =
                        reinterpret_cast<intptr_t> (p.slice ().base);
                    char* ptr = reinterpret_cast<char*> (
                        base + p.slice ().yStride * intptr_t (y) +
                        p.slice ().xStride * intptr_t (x));
                    switch (p.slice ().type)
                    {
                        case IMF::FLOAT:
                            assert (alignToFour (ptr) == ptr);
                            writtenHalf = half (*(float*) ptr);
                            break;
                        case IMF::HALF:
                            writtenHalf = half (*(half*) ptr);
                            break;
                        case IMF::UINT: continue;
                        default: cout << "don't know about that\n"; exit (1);
                    }
                }
                else
                {
                    writtenHalf = half (i.slice ().fillValue);
                }

                if (writtenHalf.bits () != readHalf.bits ())
                {
                    if (nonfatal) { return false; }
                    else
                    {
                        cout << "\n\nerror reading back channel " << i.name ()
                             << " pixel " << x << ',' << y << " got "
                             << readHalf << " expected " << writtenHalf << endl;
                        assert (writtenHalf.bits () == readHalf.bits ());
                        exit (1);
                    }
                }
            }
        }
    }
    return true;
}